

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_binary(void)

{
  long lVar1;
  byte bVar2;
  bson_subtype_t bVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  uint8_t *puVar6;
  undefined8 uVar7;
  bson_subtype_t *pbVar8;
  uint8_t **ppuVar9;
  uint32_t *puVar10;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar11;
  bson_t *bcon;
  uint8_t *binary;
  uint32_t len;
  bson_subtype_t subtype;
  
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar5 = bson_bcon_magic();
  bVar3 = bcon_ensure_subtype(BSON_SUBTYPE_BINARY);
  puVar6 = bcon_ensure_const_uint8_ptr((uint8_t *)"deadbeef");
  uVar4 = bcon_ensure_uint32(8);
  uVar5 = bcon_new(0,"foo",uVar5,4,bVar3,puVar6,CONCAT44(uVar11,uVar4),0);
  uVar7 = bson_bcone_magic();
  pbVar8 = bcon_ensure_subtype_ptr((bson_subtype_t *)((long)&binary + 4));
  ppuVar9 = bcon_ensure_const_uint8_ptr_ptr((uint8_t **)&bcon);
  puVar10 = bcon_ensure_uint32_ptr((uint32_t *)&binary);
  bVar2 = bcon_extract(uVar5,"foo",uVar7,4,pbVar8,ppuVar9,puVar10,0);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x3e,"test_binary","BCON_EXTRACT (bcon, \"foo\", BCONE_BIN (subtype, binary, len))");
    abort();
  }
  if (binary._4_4_ != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x40,"test_binary","subtype == BSON_SUBTYPE_BINARY");
    abort();
  }
  if ((int)binary != 8) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x41,"test_binary","len == 8");
    abort();
  }
  lVar1._0_4_ = bcon->flags;
  lVar1._4_4_ = bcon->len;
  if (lVar1 != 0x6665656264616564) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x42,"test_binary","memcmp (binary, \"deadbeef\", 8) == 0");
    abort();
  }
  bson_destroy(uVar5);
  return;
}

Assistant:

static void
test_binary (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_binary (
      &expected, "foo", -1, BSON_SUBTYPE_BINARY, (uint8_t *) "deadbeef", 8);

   BCON_APPEND (&bcon,
                "foo",
                BCON_BIN (BSON_SUBTYPE_BINARY, (const uint8_t *) "deadbeef", 8),
                NULL);

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}